

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_MultiGFab.cpp
# Opt level: O2

MultiFab * __thiscall
amrex::EB2::MultiGFab::getLevelSet(MultiFab *__return_storage_ptr__,MultiGFab *this)

{
  int ncomp;
  pointer pGVar1;
  int iVar2;
  double *p;
  FabFactory<amrex::FArrayBox> local_f8;
  MFIter mfi;
  IntVect local_88;
  undefined1 local_78 [24];
  pointer pbStack_60;
  pointer local_58;
  
  local_88.vect[0] = 1;
  local_88.vect[1] = 1;
  local_88.vect[2] = 1;
  convert((BoxArray *)&mfi,&(this->super_LayoutData<amrex::EB2::GFab>).super_FabArrayBase.boxarray,
          &local_88);
  local_78._16_8_ = (pointer)0x0;
  pbStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  local_78._0_8_ = (_func_int **)0x0;
  local_78._8_8_ = (Arena *)0x0;
  local_f8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_006d8928;
  MultiFab::MultiFab(__return_storage_ptr__,(BoxArray *)&mfi,
                     &(this->super_LayoutData<amrex::EB2::GFab>).super_FabArrayBase.distributionMap,
                     1,2,(MFInfo *)local_78,&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_78 + 0x10));
  BoxArray::~BoxArray((BoxArray *)&mfi);
  MFIter::MFIter(&mfi,(FabArrayBase *)this,'\0');
  while (mfi.currentIndex < mfi.endIndex) {
    iVar2 = mfi.currentIndex;
    if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
      iVar2 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [mfi.currentIndex];
    }
    pGVar1 = (this->super_LayoutData<amrex::EB2::GFab>).m_data.
             super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
             super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
             super__Vector_impl_data._M_start;
    ncomp = pGVar1[iVar2].m_levelset.nvar;
    p = BaseFab<double>::dataPtr(&pGVar1[iVar2].m_levelset,0);
    FArrayBox::FArrayBox((FArrayBox *)local_78,&pGVar1[iVar2].m_levelset.domain,ncomp,p);
    FabArray<amrex::FArrayBox>::setFab<amrex::FArrayBox,_0>
              (&__return_storage_ptr__->super_FabArray<amrex::FArrayBox>,&mfi,(FArrayBox *)local_78)
    ;
    BaseFab<double>::~BaseFab((BaseFab<double> *)local_78);
    MFIter::operator++(&mfi);
  }
  MFIter::~MFIter(&mfi);
  return __return_storage_ptr__;
}

Assistant:

MultiFab
MultiGFab::getLevelSet ()
{
    MultiFab r(amrex::convert(boxArray(),IntVect::TheNodeVector()),
               DistributionMap(), 1, GFab::ng, MFInfo().SetAlloc(false));

    for (MFIter mfi(*this); mfi.isValid(); ++mfi) {
        auto& fab = (*this)[mfi].getLevelSet();
        r.setFab(mfi, FArrayBox(fab.box(), fab.nComp(), fab.dataPtr()));
    }

    return r;
}